

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

optional<std::basic_string_view<char,_std::char_traits<char>_>_> *
slang::ast::ElabSystemTaskSymbol::createMessage
          (ASTContext *context,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> args)

{
  bool bVar1;
  Compilation *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  EvalContext *in_RDI;
  byte *mem;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  EvalContext evalCtx;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffbe8;
  EvalContext *in_stack_fffffffffffffbf0;
  size_t in_stack_fffffffffffffbf8;
  basic_string_view<char,_std::char_traits<char>_> *__str;
  char *in_stack_fffffffffffffc00;
  size_type in_stack_fffffffffffffc08;
  EvalContext *this_00;
  bitmask<slang::ast::EvalFlags> in_stack_fffffffffffffc37;
  Args *in_stack_fffffffffffffc40;
  ASTContext *in_stack_fffffffffffffc48;
  bitmask<slang::ast::EvalFlags> local_369 [273];
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_fffffffffffffda8;
  EvalContext *in_stack_fffffffffffffdb0;
  Scope *in_stack_fffffffffffffdb8;
  
  this_00 = in_RDI;
  bVar1 = FmtHelpers::checkDisplayArgs(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  if (bVar1) {
    local_369[0].m_bits = '\0';
    bitmask<slang::ast::EvalFlags>::bitmask(local_369);
    EvalContext::EvalContext(this_00,&in_RDI->astCtx,in_stack_fffffffffffffc37);
    not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x3e36ca);
    FmtHelpers::formatDisplay_abi_cxx11_
              (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    EvalContext::reportAllDiags(in_stack_fffffffffffffbf0);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x3e3711);
    if (bVar1) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x3e376c);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3e3774);
      if (bVar1) {
        sv((char *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8);
        std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
        optional<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                  ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      }
      else {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x3e37bd);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (in_RSI,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        this = ASTContext::getCompilation((ASTContext *)0x3e37df);
        pbVar2 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x3e37f3);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  (pbVar2);
        __t = (basic_string_view<char,_std::char_traits<char>_> *)
              BumpAllocator::allocate
                        (&this->super_BumpAllocator,(size_t)in_stack_fffffffffffffc00,
                         in_stack_fffffffffffffbf8);
        __str = __t;
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x3e3834);
        in_stack_fffffffffffffbf0 =
             (EvalContext *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x3e383c);
        pbVar2 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x3e384e);
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(pbVar2);
        memcpy(__t,in_stack_fffffffffffffbf0,sVar3);
        pbVar2 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x3e387e);
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(pbVar2);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffc30,
                   (char *)__str,sVar3);
        std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
        optional<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                  ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   in_stack_fffffffffffffbf0,__t);
      }
    }
    else {
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x3e371f);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x3e38bc);
    EvalContext::~EvalContext(in_stack_fffffffffffffbf0);
  }
  else {
    std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x3e367c);
  }
  return (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)this_00;
}

Assistant:

std::optional<std::string_view> ElabSystemTaskSymbol::createMessage(
    const ASTContext& context, std::span<const Expression* const> args) {

    // Check all arguments.
    if (!FmtHelpers::checkDisplayArgs(context, args))
        return {};

    // Format the message to string.
    EvalContext evalCtx(context);
    std::optional<std::string> str = FmtHelpers::formatDisplay(*context.scope, evalCtx, args);
    evalCtx.reportAllDiags();

    if (!str)
        return {};

    if (str->empty())
        return ""sv;

    str->insert(0, ": ");

    // Copy the string into permanent memory.
    auto mem = context.getCompilation().allocate(str->size(), alignof(char));
    memcpy(mem, str->data(), str->size());

    return std::string_view(reinterpret_cast<char*>(mem), str->size());
}